

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O0

bool __thiscall Employee::validate(Employee *this,string *id)

{
  int iVar1;
  char *pcVar2;
  bool local_c9;
  undefined1 local_c8 [7];
  bool flag;
  regex regPattern1;
  regex regPattern0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  string *pattern1;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *pattern0;
  string *id_local;
  Employee *this_local;
  
  pattern0 = id;
  id_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_40,"[8]{1}[4-9]{1}[*]{1}[\\D]{1,2}[0-37-9]{5}",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = &local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_80,"[9]{1}[0-9]{1}[*]{1}[\\D]{1,2}[0-37-9]{5}",
             (allocator *)
             ((long)&regPattern0._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&regPattern0._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  local_60 = &local_80;
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)
             &regPattern1._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,local_20,0x10);
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_c8,local_60,0x10);
  local_c9 = false;
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)pattern0);
  iVar1 = strcmp((char *)(long)*pcVar2,"8");
  if (iVar1 == 0) {
    local_c9 = std::
               regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                         (pattern0,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                   &regPattern1._M_automaton.
                                    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,0);
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)pattern0);
    iVar1 = strcmp((char *)(long)*pcVar2,"9");
    if (iVar1 == 0) {
      local_c9 = std::
                 regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                           (pattern0,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                     local_c8,0);
    }
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_c8);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &regPattern1._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  return local_c9;
}

Assistant:

bool Employee::validate(const string &id) {

    const string &pattern0 = "[8]{1}[4-9]{1}[*]{1}[\\D]{1,2}[0-37-9]{5}";
    const string &pattern1 = "[9]{1}[0-9]{1}[*]{1}[\\D]{1,2}[0-37-9]{5}";
    regex regPattern0(pattern0);
    regex regPattern1(pattern1);
    bool flag = false;
    if (strcmp(reinterpret_cast<const char *>(id[0]), "8") == 0)
    {
        flag = regex_match(id, regPattern0);
    }
    else if (strcmp(reinterpret_cast<const char *>(id[0]), "9") == 0)
    {
        flag = regex_match(id, regPattern1);
    }
    return flag;
}